

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void duckdb::FSSTStorage::StringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  unsigned_long num_to_round;
  uint32_t string_length;
  idx_t iVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  BufferManager *pBVar4;
  data_ptr_t pdVar5;
  StringDictionaryContainer SVar6;
  unsigned_long count;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> buffer_in;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> buffer_out;
  VectorStringBuffer *str_buffer;
  ulong uVar7;
  pointer ptr;
  pointer ptr_1;
  char *compressed_string_00;
  anon_union_16_2_67f50693_for_value aVar8;
  string_t sVar9;
  bitpacking_width_t width;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> delta_decode_buffer;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true> bitunpack_buffer;
  string_t compressed_string;
  BufferHandle handle;
  duckdb_fsst_decoder_t decoder;
  
  pBVar4 = BufferManager::GetBufferManager(segment->db);
  (*pBVar4->_vptr_BufferManager[7])(&handle,pBVar4,&segment->block);
  pdVar5 = BufferHandle::Ptr(&handle);
  iVar1 = segment->offset;
  SVar6 = GetDictionary(segment,&handle);
  bVar3 = ParseFSSTSegmentHeader(pdVar5 + iVar1,&decoder,&width);
  pdVar2 = result->data;
  if (bVar3) {
    num_to_round = row_id + 1;
    count = BitpackingPrimitives::RoundUpToAlgorithmGroupSize<unsigned_long>(num_to_round);
    buffer_in._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
         operator_new__(-(ulong)(count >> 0x3e != 0) | count * 4);
    bitunpack_buffer.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
         (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
         buffer_in._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    BitUnpackRange(pdVar5 + iVar1 + 0x10,
                   (data_ptr_t)
                   buffer_in._M_t.
                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                   super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,count,0,width);
    uVar7 = 0xffffffffffffffff;
    if (num_to_round < 0x4000000000000000) {
      uVar7 = num_to_round * 4;
    }
    buffer_out._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)
         operator_new__(uVar7);
    delta_decode_buffer.super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
         (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)
         buffer_out._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
         _M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    DeltaDecodeIndices((uint32_t *)
                       buffer_in._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,
                       (uint32_t *)
                       buffer_out._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,num_to_round,0);
    unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true>::AssertNotNull(false);
    string_length =
         *(uint32_t *)
          ((long)buffer_in._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                 super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + row_id * 4);
    unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>,_true>::AssertNotNull(false);
    aVar8.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         UncompressedStringStorage::FetchStringFromDict
                   (segment,SVar6.end,result,pdVar5 + iVar1,
                    *(uint32_t *)
                     ((long)buffer_out._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                            .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + row_id * 4)
                    ,string_length);
    compressed_string.value =
         (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer;
    str_buffer = StringVector::GetStringBuffer(result);
    compressed_string_00 = aVar8.pointer.ptr;
    if (aVar8.pointer.length < 0xd) {
      compressed_string_00 = compressed_string.value.pointer.prefix;
    }
    sVar9 = FSSTPrimitives::DecompressValue
                      (&decoder,str_buffer,compressed_string_00,aVar8._0_8_ & 0xffffffff);
    *(long *)(pdVar2 + result_idx * 0x10) = sVar9.value._0_8_;
    *(long *)(pdVar2 + result_idx * 0x10 + 8) = sVar9.value._8_8_;
    ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
              (&delta_decode_buffer.
                super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>);
    ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
              (&bitunpack_buffer.
                super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>);
  }
  else {
    pdVar2 = pdVar2 + result_idx * 0x10;
    pdVar2[0] = '\0';
    pdVar2[1] = '\0';
    pdVar2[2] = '\0';
    pdVar2[3] = '\0';
    pdVar2[4] = '\0';
    pdVar2[5] = '\0';
    pdVar2[6] = '\0';
    pdVar2[7] = '\0';
    pdVar2[8] = '\0';
    pdVar2[9] = '\0';
    pdVar2[10] = '\0';
    pdVar2[0xb] = '\0';
    pdVar2[0xc] = '\0';
    pdVar2[0xd] = '\0';
    pdVar2[0xe] = '\0';
    pdVar2[0xf] = '\0';
  }
  BufferHandle::~BufferHandle(&handle);
  return;
}

Assistant:

void FSSTStorage::StringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                                 idx_t result_idx) {

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	auto base_ptr = handle.Ptr() + segment.GetBlockOffset();
	auto base_data = data_ptr_cast(base_ptr + sizeof(fsst_compression_header_t));
	auto dict = GetDictionary(segment, handle);

	duckdb_fsst_decoder_t decoder;
	bitpacking_width_t width;
	auto have_symbol_table = ParseFSSTSegmentHeader(base_ptr, &decoder, &width);

	auto result_data = FlatVector::GetData<string_t>(result);
	if (!have_symbol_table) {
		// There is no FSST symtable. This is only the case for empty strings or NULLs. We emit an empty string.
		result_data[result_idx] = string_t(nullptr, 0);
		return;
	}

	// We basically just do a scan of 1 which is kinda expensive as we need to repeatedly delta decode until we
	// reach the row we want, we could consider a more clever caching trick if this is slow
	auto offsets = CalculateBpDeltaOffsets(-1, UnsafeNumericCast<idx_t>(row_id), 1);

	auto bitunpack_buffer = unique_ptr<uint32_t[]>(new uint32_t[offsets.total_bitunpack_count]);
	BitUnpackRange(base_data, data_ptr_cast(bitunpack_buffer.get()), offsets.total_bitunpack_count,
	               offsets.bitunpack_start_row, width);
	auto delta_decode_buffer = unique_ptr<uint32_t[]>(new uint32_t[offsets.total_delta_decode_count]);
	DeltaDecodeIndices(bitunpack_buffer.get() + offsets.bitunpack_alignment_offset, delta_decode_buffer.get(),
	                   offsets.total_delta_decode_count, 0);

	uint32_t string_length = bitunpack_buffer[offsets.scan_offset];

	string_t compressed_string = UncompressedStringStorage::FetchStringFromDict(
	    segment, dict.end, result, base_ptr,
	    UnsafeNumericCast<int32_t>(delta_decode_buffer[offsets.unused_delta_decoded_values]), string_length);

	auto &str_buffer = StringVector::GetStringBuffer(result);
	result_data[result_idx] = FSSTPrimitives::DecompressValue((void *)&decoder, str_buffer, compressed_string.GetData(),
	                                                          compressed_string.GetSize());
}